

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::ParseDescriptorResponse::ParseDescriptorResponse(ParseDescriptorResponse *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::ParseDescriptorResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ParseDescriptorResponse_00a87010;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->type_)._M_dataplus._M_p = (pointer)&(this->type_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->type_,"");
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  (this->locking_script_)._M_dataplus._M_p = (pointer)&(this->locking_script_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->locking_script_,"");
  (this->hash_type_)._M_dataplus._M_p = (pointer)&(this->hash_type_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->hash_type_,"");
  (this->redeem_script_)._M_dataplus._M_p = (pointer)&(this->redeem_script_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->redeem_script_,"");
  this->include_multisig_ = false;
  (this->tree_string_)._M_dataplus._M_p = (pointer)&(this->tree_string_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->tree_string_,"");
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>.
  super_vector<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>.
  super_vector<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>.
  super_vector<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorKeyJson,_std::allocator<cfd::js::api::json::DescriptorKeyJson>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keys_).super_JsonVector<cfd::js::api::json::DescriptorKeyJson>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a870a8;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>.
  super_vector<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>.
  super_vector<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>.
  super_vector<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  .
  super__Vector_base<cfd::js::api::json::DescriptorScriptJson,_std::allocator<cfd::js::api::json::DescriptorScriptJson>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scripts_).super_JsonVector<cfd::js::api::json::DescriptorScriptJson>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00a871f0;
  CollectFieldName();
  return;
}

Assistant:

ParseDescriptorResponse() {
    CollectFieldName();
  }